

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::cbow
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line)

{
  const_iterator __position;
  result_type_conflict1 rVar1;
  element_type *peVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  vector<int,_std::allocator<int>_> *pvVar3;
  size_type sVar4;
  iterator __x;
  vector<int,_std::allocator<int>_> *in_RDX;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  int i;
  vector<int,_std::allocator<int>_> ngramsmod;
  vector<int,_std::allocator<int>_> *ngrams;
  int32_t c;
  int32_t boundary;
  int32_t w;
  int factor;
  uniform_int_distribution<int> uniform;
  vector<int,_std::allocator<int>_> bow;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  Dictionary *in_stack_fffffffffffffee0;
  iterator in_stack_fffffffffffffef0;
  ulong in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  iterator in_stack_ffffffffffffff38;
  const_iterator in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int iVar5;
  undefined1 local_80 [128];
  
  local_80._96_8_ = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1aca72);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1aca7c);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
             in_stack_fffffffffffffed8);
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1acaa0);
  local_80._48_4_ = peVar2->factor;
  local_80._44_4_ = 0;
  while( true ) {
    __last._M_current = (int *)(long)(int)local_80._44_4_;
    pvVar3 = (vector<int,_std::allocator<int>_> *)
             std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)local_80._96_8_);
    if (pvVar3 <= __last._M_current) break;
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)in_stack_fffffffffffffee0,
                       (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_80._40_4_ = rVar1;
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1acb1a);
    for (local_80._36_4_ = -local_80._40_4_; (int)local_80._36_4_ <= (int)local_80._40_4_;
        local_80._36_4_ = local_80._36_4_ + 1) {
      if ((local_80._36_4_ != 0) && (-1 < (int)(local_80._44_4_ + local_80._36_4_))) {
        in_stack_ffffffffffffff18 = (ulong)(int)(local_80._44_4_ + local_80._36_4_);
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_80._96_8_);
        if (in_stack_ffffffffffffff18 < sVar4) {
          std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1acba4);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)local_80._96_8_,
                     (long)(int)(local_80._44_4_ + local_80._36_4_));
          local_80._24_8_ =
               Dictionary::getSubwords(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_RDI._M_current,
                     (vector<int,_std::allocator<int>_> *)__last._M_current);
          sVar4 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_80);
          if (sVar4 != 0) {
            for (iVar5 = 0; iVar5 < (int)local_80._48_4_; iVar5 = iVar5 + 1) {
              __x = std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
              __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
              __normal_iterator<int*>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffee0,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_80,0);
              __position._M_current._4_4_ = iVar5;
              __position._M_current._0_4_ = in_stack_ffffffffffffff78;
              std::vector<int,_std::allocator<int>_>::insert
                        (in_stack_ffffffffffffff70,__position,__x._M_current);
            }
          }
          std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
          __normal_iterator<int*>
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_fffffffffffffee0,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          in_stack_fffffffffffffee0 = (Dictionary *)local_80;
          std::vector<int,_std::allocator<int>_>::cbegin
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          in_stack_ffffffffffffff40 =
               std::vector<int,_std::allocator<int>_>::cend
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          in_stack_fffffffffffffef0 =
               std::vector<int,std::allocator<int>>::
               insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,void>
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(rVar1,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff38._M_current,in_RDI,__last);
          in_stack_ffffffffffffff38 = in_stack_fffffffffffffef0;
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0._M_current);
        }
      }
    }
    std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1acda2);
    Model::update((Model *)in_stack_ffffffffffffff40._M_current,
                  (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38._M_current,
                  (vector<int,_std::allocator<int>_> *)in_RDI._M_current,
                  (int32_t)((ulong)__last._M_current >> 0x20),SUB84(__last._M_current,0),
                  (State *)CONCAT44(rVar1,in_stack_ffffffffffffff20),
                  (int)(in_stack_ffffffffffffff18 >> 0x20));
    local_80._44_4_ = local_80._44_4_ + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0._M_current);
  return;
}

Assistant:

void FastText::cbow(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line) {
  std::vector<int32_t> bow;
  std::uniform_int_distribution<> uniform(1, args_->ws);
  int factor = args_->factor;
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(state.rng);
    bow.clear();
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
        const std::vector<int32_t>& ngrams = dict_->getSubwords(line[w + c]);
        std::vector<int32_t> ngramsmod = ngrams;
        if (ngramsmod.size() > 0) {
            for (int i=0; i<factor; i++) ngramsmod.insert(ngramsmod.end(),ngramsmod[0]); //mod avg-pool to weighted-avg-pool
        }
        bow.insert(bow.end(), ngramsmod.cbegin(), ngramsmod.cend());
      }
    }
      model_->update(bow, line, w, lr, state, factor);
  }
}